

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall
icu_63::RBBITableBuilder::addRuleRootNodes(RBBITableBuilder *this,UVector *dest,RBBINode *node)

{
  UBool UVar1;
  RBBINode *node_local;
  UVector *dest_local;
  RBBITableBuilder *this_local;
  
  if ((node != (RBBINode *)0x0) && (UVar1 = ::U_FAILURE(*this->fStatus), UVar1 == '\0')) {
    if (node->fRuleRoot == '\0') {
      addRuleRootNodes(this,dest,node->fLeftChild);
      addRuleRootNodes(this,dest,node->fRightChild);
    }
    else {
      UVector::addElement(dest,node,this->fStatus);
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::addRuleRootNodes(UVector *dest, RBBINode *node) {
    if (node == NULL || U_FAILURE(*fStatus)) {
        return;
    }
    if (node->fRuleRoot) {
        dest->addElement(node, *fStatus);
        // Note: rules cannot nest. If we found a rule start node,
        //       no child node can also be a start node.
        return;
    }
    addRuleRootNodes(dest, node->fLeftChild);
    addRuleRootNodes(dest, node->fRightChild);
}